

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O0

string * __thiscall
FastPForLib::OPTPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_
          (OPTPFor<4U,_FastPForLib::Simple16<false>_> *this)

{
  ostream *poVar1;
  string *in_RDI;
  ostringstream convert;
  ostringstream *this_00;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  this_00 = local_188;
  std::__cxx11::ostringstream::ostringstream(this_00);
  poVar1 = std::operator<<((ostream *)this_00,"OPTPFor<");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,4);
  poVar1 = std::operator<<(poVar1,",");
  Simple16<false>::name_abi_cxx11_((Simple16<false> *)this_00);
  poVar1 = std::operator<<(poVar1,local_1b8);
  std::operator<<(poVar1,">");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

virtual std::string name() const {
    std::ostringstream convert;
    convert
        << "OPTPFor<" << BlockSizeInUnitsOfPackSize << ","
        << NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::ecoder.name()
        << ">";
    return convert.str();
  }